

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O1

void RigidBodyDynamics::SolveContactSystemRangeSpaceSparse
               (Model *model,MatrixNd *H,MatrixNd *G,VectorNd *c,VectorNd *gamma,VectorNd *qddot,
               VectorNd *lambda,MatrixNd *K,VectorNd *a,LinearSolver linear_solver)

{
  double **ppdVar1;
  double dVar2;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *pLVar3;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this;
  undefined8 *puVar4;
  double *pdVar5;
  ulong uVar6;
  ActualDstType actualDst_1;
  double *pdVar7;
  ActualDstType actualDst;
  long lVar8;
  long lVar9;
  double *pdVar10;
  ulong uVar11;
  long lVar12;
  ActualDstType actualDst_2;
  ulong uVar13;
  VectorNd z;
  assign_op<double,_double> local_c9;
  SrcXprType local_c8;
  DenseStorage<double,__1,__1,__1,_0> local_b8;
  DenseStorage<double,__1,__1,_1,_0> *local_98;
  MatrixNd *local_90;
  VectorNd *local_88;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_80;
  DenseStorage<double,__1,__1,_1,_0> local_78;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> local_68;
  ulong local_40;
  ulong local_38;
  
  local_98 = (DenseStorage<double,__1,__1,_1,_0> *)c;
  local_88 = gamma;
  Math::SparseFactorizeLTL(model,H);
  local_b8.m_data = (double *)0x0;
  local_b8.m_rows = 0;
  local_b8.m_cols = 0;
  pdVar7 = (G->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  lVar8 = (G->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  lVar9 = (G->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_90 = G;
  if ((lVar9 != 0) || (lVar8 != 0)) {
    if ((lVar8 != 0 && lVar9 != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar8),0) < lVar9)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = std::operator<<;
      __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_b8,lVar9 * lVar8,lVar9,lVar8);
  }
  if (0 < local_b8.m_cols) {
    lVar9 = 0;
    pdVar5 = local_b8.m_data;
    do {
      if (0 < local_b8.m_rows) {
        lVar12 = 0;
        pdVar10 = pdVar7;
        do {
          pdVar5[lVar12] = *pdVar10;
          lVar12 = lVar12 + 1;
          pdVar10 = pdVar10 + lVar8;
        } while (local_b8.m_rows != lVar12);
      }
      lVar9 = lVar9 + 1;
      pdVar7 = pdVar7 + 1;
      pdVar5 = pdVar5 + local_b8.m_rows;
    } while (lVar9 != local_b8.m_cols);
  }
  local_80 = &qddot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
  if (0 < local_b8.m_cols) {
    uVar13 = 0;
    do {
      local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_data = local_b8.m_data + local_b8.m_rows * uVar13;
      local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows = local_b8.m_rows;
      local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols = 1;
      local_68.m_l1_norm = (RealScalar)&local_b8;
      local_68.m_isInitialized = false;
      local_68._33_3_ = 0;
      local_68.m_info = Success;
      local_38 = local_b8.m_rows;
      local_40 = uVar13;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_c8,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                  *)&local_68);
      Math::SparseSolveLTx(model,H,(VectorNd *)&local_c8);
      pdVar7 = local_b8.m_data + uVar13 * local_b8.m_rows;
      if (((ulong)pdVar7 & 7) == 0) {
        uVar6 = (ulong)((uint)((ulong)pdVar7 >> 3) & 1);
        if (local_b8.m_rows <= (long)uVar6) {
          uVar6 = local_b8.m_rows;
        }
        if (0 < (long)uVar6) {
          *pdVar7 = (double)((local_c8.m_dec)->m_matrix).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data;
        }
        uVar11 = local_b8.m_rows - uVar6 & 0xfffffffffffffffe;
        lVar8 = uVar6 + uVar11;
        if (0 < (long)uVar11) {
          do {
            ppdVar1 = &((local_c8.m_dec)->m_matrix).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_data + uVar6;
            dVar2 = (double)ppdVar1[1];
            local_b8.m_data[uVar6 + local_b8.m_rows * uVar13] = (double)*ppdVar1;
            (local_b8.m_data + uVar6 + local_b8.m_rows * uVar13)[1] = dVar2;
            uVar6 = uVar6 + 2;
          } while ((long)uVar6 < lVar8);
        }
        if (lVar8 < local_b8.m_rows) {
          do {
            local_b8.m_data[local_b8.m_rows * uVar13 + lVar8] =
                 (double)(&((local_c8.m_dec)->m_matrix).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_data)[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 < local_b8.m_rows);
        }
      }
      else if (0 < local_b8.m_rows) {
        lVar8 = 0;
        do {
          local_b8.m_data[lVar8 + local_b8.m_rows * uVar13] =
               (double)(&((local_c8.m_dec)->m_matrix).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_data)[lVar8];
          lVar8 = lVar8 + 1;
        } while (local_b8.m_rows != lVar8);
      }
      free(local_c8.m_dec);
      uVar13 = (ulong)((int)uVar13 + 1);
    } while ((long)uVar13 < local_b8.m_cols);
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_78,local_98);
  Math::SparseSolveLTx(model,H,(VectorNd *)&local_78);
  this = local_80;
  local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)&local_b8;
  local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = (Index)&local_b8;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::internal::assign_op<double,double>>
            (K,(Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                *)&local_68,(assign_op<double,_double> *)&local_c8,(type)0x0);
  local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)local_88;
  local_c8.m_dec = (LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)0x0;
  local_c8.m_rhs = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
  local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = (Index)&local_b8;
  local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = (Index)&local_78;
  Eigen::internal::
  assignment_from_xpr_op_product<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Matrix<double,-1,1,0,-1,1>,0>,Eigen::internal::assign_op<double,double>,Eigen::internal::sub_assign_op<double,double>>
  ::
  run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_c8,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)&local_68,&local_c9);
  pLVar3 = local_c8.m_dec;
  if ((Matrix<double,__1,_1,_0,__1,_1> *)
      (a->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      local_c8.m_rhs) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&a->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (Index)local_c8.m_rhs,1);
  }
  pdVar7 = (a->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar13 = (a->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  uVar6 = uVar13 - ((long)uVar13 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar13) {
    lVar8 = 0;
    do {
      ppdVar1 = &(pLVar3->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 .m_storage.m_data + lVar8;
      dVar2 = (double)ppdVar1[1];
      pdVar5 = pdVar7 + lVar8;
      *pdVar5 = (double)*ppdVar1;
      pdVar5[1] = dVar2;
      lVar8 = lVar8 + 2;
    } while (lVar8 < (long)uVar6);
  }
  if ((long)uVar6 < (long)uVar13) {
    do {
      pdVar7[uVar6] =
           (double)(&(pLVar3->m_matrix).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_data)[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar13 != uVar6);
  }
  free(local_c8.m_dec);
  Eigen::LLT<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)&local_68,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)K);
  local_c8.m_rhs = a;
  local_c8.m_dec = &local_68;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(lambda,&local_c8,&local_c9);
  free(local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)local_98;
  local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = (Index)local_90;
  local_68.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = (Index)lambda;
  local_c8.m_dec = (LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)0x0;
  local_c8.m_rhs = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
  Eigen::internal::
  assignment_from_xpr_op_product<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>const>,Eigen::Matrix<double,-1,1,0,-1,1>,0>,Eigen::internal::assign_op<double,double>,Eigen::internal::add_assign_op<double,double>>
  ::
  run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_c8,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)&local_68,&local_c9);
  pLVar3 = local_c8.m_dec;
  if ((Matrix<double,__1,_1,_0,__1,_1> *)(this->m_storage).m_rows != local_c8.m_rhs) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (this,(Index)local_c8.m_rhs,1);
  }
  pdVar7 = (this->m_storage).m_data;
  uVar13 = (this->m_storage).m_rows;
  uVar6 = uVar13 - ((long)uVar13 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar13) {
    lVar8 = 0;
    do {
      ppdVar1 = &(pLVar3->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 .m_storage.m_data + lVar8;
      dVar2 = (double)ppdVar1[1];
      pdVar5 = pdVar7 + lVar8;
      *pdVar5 = (double)*ppdVar1;
      pdVar5[1] = dVar2;
      lVar8 = lVar8 + 2;
    } while (lVar8 < (long)uVar6);
  }
  if ((long)uVar6 < (long)uVar13) {
    do {
      pdVar7[uVar6] =
           (double)(&(pLVar3->m_matrix).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_data)[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar13 != uVar6);
  }
  free(local_c8.m_dec);
  Math::SparseSolveLTx(model,H,(VectorNd *)this);
  Math::SparseSolveLx(model,H,(VectorNd *)this);
  free(local_78.m_data);
  free(local_b8.m_data);
  return;
}

Assistant:

RBDL_DLLAPI
void SolveContactSystemRangeSpaceSparse (
		Model &model, 
		Math::MatrixNd &H, 
		const Math::MatrixNd &G, 
		const Math::VectorNd &c, 
		const Math::VectorNd &gamma, 
		Math::VectorNd &qddot, 
		Math::VectorNd &lambda, 
		Math::MatrixNd &K, 
		Math::VectorNd &a,
		Math::LinearSolver linear_solver
	) {
	SparseFactorizeLTL (model, H);

	MatrixNd Y (G.transpose());

	for (unsigned int i = 0; i < Y.cols(); i++) {
		VectorNd Y_col = Y.block(0,i,Y.rows(),1);
		SparseSolveLTx (model, H, Y_col);
		Y.block(0,i,Y.rows(),1) = Y_col;
	}

	VectorNd z (c);
	SparseSolveLTx (model, H, z);

	K = Y.transpose() * Y;

	a = gamma - Y.transpose() * z;

	lambda = K.llt().solve(a);

	qddot = c + G.transpose() * lambda;
	SparseSolveLTx (model, H, qddot);
	SparseSolveLx (model, H, qddot);
}